

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview_p.h
# Opt level: O2

void __thiscall QHeaderViewPrivate::setDefaultValues(QHeaderViewPrivate *this,Orientation o)

{
  this->orientation = o;
  updateDefaultSectionSizeFromStyle(this);
  (this->defaultAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
  super_QFlagsStorage<Qt::AlignmentFlag>.i = (uint)(o == Horizontal) * 3 + 0x81;
  return;
}

Assistant:

inline void setDefaultValues(Qt::Orientation o) {
        orientation = o;
        updateDefaultSectionSizeFromStyle();
        defaultAlignment = (o == Qt::Horizontal
                            ? Qt::Alignment(Qt::AlignCenter)
                            : Qt::AlignLeft|Qt::AlignVCenter);
    }